

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

CanonicalSet * __thiscall
parser::Parser::items
          (CanonicalSet *__return_storage_ptr__,Parser *this,Grammar *grammar,
          UniqueGrammaticSymbols *uniqueGrammaticSymbols)

{
  _Rep_type *p_Var1;
  __normal_iterator<parser::CanonicalItem_*,_std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>_>
  _Var2;
  _Base_ptr p_Var3;
  pointer pCVar4;
  CanonicalSet t;
  Situations situations;
  Situations goToSituation;
  Situation start;
  int local_fc;
  _Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_> local_f8;
  UniqueGrammaticSymbols *local_d8;
  Grammar *local_d0;
  vector<parser::Situation,_std::allocator<parser::Situation>_> local_c8;
  CanonicalItem local_a8;
  pointer local_88;
  Parser *local_80;
  Situations local_78;
  Situation local_60;
  
  (__return_storage_ptr__->
  super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  local_78.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ =
       local_78.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_ & 0xffffff00;
  local_d8 = uniqueGrammaticSymbols;
  local_d0 = grammar;
  local_80 = this;
  common::make_vector<parser::GrammaticSymbol>::make_vector
            ((make_vector<parser::GrammaticSymbol> *)&local_f8,(GrammaticSymbol *)&local_78);
  std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>::vector
            ((vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_> *)&local_a8,
             (vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_> *)&local_f8)
  ;
  Situation::Situation(&local_60,0,(GrammaticSymbols *)&local_a8);
  std::_Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>::
  ~_Vector_base((_Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_> *)
                &local_a8);
  std::_Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>::
  ~_Vector_base(&local_f8);
  std::vector<parser::Situation,_std::allocator<parser::Situation>_>::push_back(&local_c8,&local_60)
  ;
  closure(&local_c8,local_d0,&local_60);
  local_a8.terminal.value = -1;
  local_a8.terminal.isTerminal = true;
  local_a8.terminal._5_3_ = 0;
  std::vector<parser::Situation,_std::allocator<parser::Situation>_>::vector
            (&local_a8.situations,&local_c8);
  std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::
  emplace_back<parser::CanonicalItem>(__return_storage_ptr__,&local_a8);
  std::vector<parser::Situation,_std::allocator<parser::Situation>_>::~vector(&local_a8.situations);
  p_Var1 = &local_d8->_M_t;
  do {
    local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pCVar4 = (__return_storage_ptr__->
             super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>).
             _M_impl.super__Vector_impl_data._M_start;
    local_fc = 0;
    while (pCVar4 != (__return_storage_ptr__->
                     super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                     )._M_impl.super__Vector_impl_data._M_finish) {
      local_88 = pCVar4;
      for (p_Var3 = (local_d8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var3 != &(p_Var1->_M_impl).super__Rb_tree_header;
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
        goTo(&local_78,local_80,local_d0,&pCVar4->situations,(GrammaticSymbol *)(p_Var3 + 1));
        if ((pointer)CONCAT44(local_78.
                              super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              (int)local_78.
                                   super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>
                                   ._M_impl.super__Vector_impl_data._M_start) !=
            local_78.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          _Var2 = std::
                  __find_if<__gnu_cxx::__normal_iterator<parser::CanonicalItem*,std::vector<parser::CanonicalItem,std::allocator<parser::CanonicalItem>>>,__gnu_cxx::__ops::_Iter_pred<parser::Pred>>
                            ((__return_storage_ptr__->
                             super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                             )._M_impl.super__Vector_impl_data._M_start,
                             (__return_storage_ptr__->
                             super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>
                             )._M_impl.super__Vector_impl_data._M_finish,&local_78);
          if (_Var2._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>).
              _M_impl.super__Vector_impl_data._M_finish) {
            _Var2 = std::
                    __find_if<__gnu_cxx::__normal_iterator<parser::CanonicalItem*,std::vector<parser::CanonicalItem,std::allocator<parser::CanonicalItem>>>,__gnu_cxx::__ops::_Iter_pred<parser::Pred>>
                              (local_f8._M_impl.super__Vector_impl_data._M_start,
                               local_f8._M_impl.super__Vector_impl_data._M_finish,&local_78);
            if (_Var2._M_current ==
                (CanonicalItem *)local_f8._M_impl.super__Vector_impl_data._M_finish) {
              CanonicalItem::CanonicalItem(&local_a8,(GrammaticSymbol *)(p_Var3 + 1),&local_78);
              std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::
              emplace_back<parser::CanonicalItem>
                        ((vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_> *)
                         &local_f8,&local_a8);
              std::vector<parser::Situation,_std::allocator<parser::Situation>_>::~vector
                        (&local_a8.situations);
              local_fc = local_fc + 1;
            }
          }
        }
        std::vector<parser::Situation,_std::allocator<parser::Situation>_>::~vector(&local_78);
      }
      pCVar4 = local_88 + 1;
    }
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<parser::CanonicalItem*,std::back_insert_iterator<std::vector<parser::CanonicalItem,std::allocator<parser::CanonicalItem>>>>
              ((CanonicalItem *)local_f8._M_impl.super__Vector_impl_data._M_start,
               (CanonicalItem *)local_f8._M_impl.super__Vector_impl_data._M_finish,
               (back_insert_iterator<std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>_>
                )__return_storage_ptr__);
    std::vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_>::~vector
              ((vector<parser::CanonicalItem,_std::allocator<parser::CanonicalItem>_> *)&local_f8);
  } while (0 < local_fc);
  Convolution::~Convolution(&local_60.super_Convolution);
  std::vector<parser::Situation,_std::allocator<parser::Situation>_>::~vector(&local_c8);
  return __return_storage_ptr__;
}

Assistant:

CanonicalSet items(Grammar const& grammar, UniqueGrammaticSymbols const& uniqueGrammaticSymbols) {
            CanonicalSet canonicalSet;

            Situations situations;
            Situation start(StartNonTerminal, MakeGrammaticSymbols(GrammaticSymbol(InitialNonTerminal, false)));
            situations.push_back(start);
            closure(situations, grammar, start);

            canonicalSet.push_back(CanonicalItem(GrammaticSymbol(lexer::InvalidToken), situations));

            int itemAdded;
            do {
                itemAdded = 0;
                CanonicalSet t;
                for_each(CanonicalSet, canonicalSet, canonicalItem) {
                    for_each(UniqueGrammaticSymbols, uniqueGrammaticSymbols, symbol) {
                        Situations goToSituation = goTo(grammar, canonicalItem->situations, *symbol);
                        if (goToSituation.empty())
                            continue;
                        if (std::find_if(canonicalSet.begin(), canonicalSet.end(), Pred(goToSituation)) == canonicalSet.end() &&
                            std::find_if(t.begin(), t.end(), Pred(goToSituation)) == t.end()) {
                            t.push_back(CanonicalItem(*symbol, goToSituation));
                            itemAdded++;
                        }
                    }
                }
                std::copy(t.begin(), t.end(), std::back_inserter(canonicalSet));
            } while (itemAdded > 0);

            return canonicalSet;
        }